

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

void D_DoServerInfoChange(BYTE **stream,bool singlebit)

{
  BYTE *__src;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FBoolCVar *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong __n;
  ECVarType type;
  userinfo_t *this_00;
  int i;
  long lVar5;
  UCVarValue local_88;
  ECVarType local_7c;
  char name [64];
  
  uVar2 = ReadByte(stream);
  __n = (ulong)(uVar2 & 0x3f);
  if ((uVar2 & 0x3f) == 0) {
    return;
  }
  type = (int)uVar2 >> 6;
  __src = *stream;
  memcpy(name,__src,__n);
  *stream = __src + __n;
  name[__n] = '\0';
  local_7c = type;
  this = (FBoolCVar *)FindCVar(name,(FBaseCVar **)0x0);
  if (singlebit) {
    if (this == (FBoolCVar *)0x0) {
LAB_0038cb4a:
      bVar1 = true;
      goto LAB_0038cb4d;
    }
    uVar2 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[5])(this,&local_7c);
    if (local_7c != CVAR_Int) {
      return;
    }
    uVar3 = ReadByte(stream);
    local_88.Int = uVar2 | 1 << (uVar3 & 0x1f);
    if ((uVar3 & 0x20) == 0) {
      local_88.Int = uVar2 & ~(1 << (uVar3 & 0x1f));
    }
    local_88._4_4_ = extraout_var;
    type = local_7c;
  }
  else {
    switch(type) {
    case CVAR_Bool:
      iVar4 = ReadByte(stream);
      local_88.Bool = iVar4 != 0;
      break;
    case CVAR_Int:
      local_88.Int = ReadLong(stream);
      break;
    case CVAR_Float:
      local_88.Float = ReadFloat(stream);
      break;
    case CVAR_String:
      local_88.String = ReadString(stream);
    }
    if (this == (FBoolCVar *)0x0) goto LAB_0038cb4a;
  }
  bVar1 = false;
  FBaseCVar::ForceSet((FBaseCVar *)this,local_88,type,false);
  type = local_7c;
LAB_0038cb4d:
  if ((type == CVAR_String) && (local_88.String != (char *)0x0)) {
    operator_delete__(local_88.String);
  }
  if (this == &teamplay) {
    this_00 = (userinfo_t *)&DAT_017dbfb8;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (playeringame[lVar5] == true) {
        iVar4 = userinfo_t::GetTeam(this_00);
        UpdateTeam((int)lVar5,iVar4,true);
      }
      this_00 = this_00 + 0x1c;
    }
  }
  if (!bVar1) {
    iVar4 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[4])(this,3);
    if ((CONCAT44(extraout_var_00,iVar4) != 0) && (netgame == true)) {
      Printf("%s changed to %s\n",name,CONCAT44(extraout_var_00,iVar4));
    }
  }
  return;
}

Assistant:

void D_DoServerInfoChange (BYTE **stream, bool singlebit)
{
	const char *value;
	char name[64];
	int len;
	int type;

	len = ReadByte (stream);
	type = len >> 6;
	len &= 0x3f;
	if (len == 0)
		return;
	memcpy (name, *stream, len);
	*stream += len;
	name[len] = 0;

	if ( (value = SetServerVar (name, (ECVarType)type, stream, singlebit)) && netgame)
	{
		Printf ("%s changed to %s\n", name, value);
	}
}